

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

void __thiscall
capnp::MallocMessageBuilder::MallocMessageBuilder
          (MallocMessageBuilder *this,ArrayPtr<capnp::word> firstSegment,
          AllocationStrategy allocationStrategy)

{
  bool bVar1;
  size_t sVar2;
  word *pwVar3;
  Fault local_c0;
  Fault f_1;
  unsigned_long *local_b0;
  undefined1 local_a8 [8];
  DebugComparison<unsigned_long_&,_int> _kjCondition_1;
  Fault f;
  size_t local_70;
  DebugExpression<unsigned_long> local_68;
  undefined1 local_60 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  AllocationStrategy allocationStrategy_local;
  MallocMessageBuilder *this_local;
  ArrayPtr<capnp::word> firstSegment_local;
  
  firstSegment_local.ptr = (word *)firstSegment.size_;
  this_local = (MallocMessageBuilder *)firstSegment.ptr;
  MessageBuilder::MessageBuilder(&this->super_MessageBuilder);
  (this->super_MessageBuilder)._vptr_MessageBuilder =
       (_func_int **)&PTR__MallocMessageBuilder_00430c28;
  sVar2 = kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)&this_local);
  *(int *)&(this->super_MessageBuilder).field_0xbc = (int)sVar2;
  this->allocationStrategy = allocationStrategy;
  this->ownFirstSegment = false;
  this->returnedFirstSegment = false;
  pwVar3 = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)&this_local);
  this->firstSegment = pwVar3;
  kj::Vector<void_*>::Vector(&this->moreSegments);
  local_70 = kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)&this_local);
  local_68 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_70);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator>
            ((DebugComparison<unsigned_long,_int> *)local_60,&local_68,
             (int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[37]>
              ((Fault *)&_kjCondition_1.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
               ,0xdd,FAILED,"firstSegment.size() > 0",
               "_kjCondition,\"First segment size must be non-zero.\"",
               (DebugComparison<unsigned_long,_int> *)local_60,
               (char (*) [37])"First segment size must be non-zero.");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1.result);
  }
  pwVar3 = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)&this_local);
  local_b0 = (unsigned_long *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&pwVar3->content);
  f_1.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long&>::operator==
            ((DebugComparison<unsigned_long_&,_int> *)local_a8,
             (DebugExpression<unsigned_long&> *)&local_b0,(int *)((long)&f_1.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a8);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[30]>
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
               ,0xe1,FAILED,"*reinterpret_cast<uint64_t*>(firstSegment.begin()) == 0",
               "_kjCondition,\"First segment must be zeroed.\"",
               (DebugComparison<unsigned_long_&,_int> *)local_a8,
               (char (*) [30])"First segment must be zeroed.");
    kj::_::Debug::Fault::fatal(&local_c0);
  }
  return;
}

Assistant:

MallocMessageBuilder::MallocMessageBuilder(
    kj::ArrayPtr<word> firstSegment, AllocationStrategy allocationStrategy)
    : nextSize(firstSegment.size()), allocationStrategy(allocationStrategy),
      ownFirstSegment(false), returnedFirstSegment(false), firstSegment(firstSegment.begin()) {
  KJ_REQUIRE(firstSegment.size() > 0, "First segment size must be non-zero.");

  // Checking just the first word should catch most cases of failing to zero the segment.
  KJ_REQUIRE(*reinterpret_cast<uint64_t*>(firstSegment.begin()) == 0,
          "First segment must be zeroed.");
}